

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int quicly_accept(quicly_conn_t **conn,quicly_context_t *ctx,sockaddr *dest_addr,sockaddr *src_addr,
                 quicly_decoded_packet_t *packet,quicly_address_token_plaintext_t *address_token,
                 quicly_cid_plaintext_t *new_cid,ptls_handshake_properties_t *handshake_properties)

{
  anon_struct_4_2_d91fd178_for_address_validation *paVar1;
  anon_struct_464_5_de580c36_for_stats *paVar2;
  anon_struct_16_2_d6821df0_for_num_bytes *paVar3;
  uint8_t uVar4;
  uint32_t protocol_version;
  uint uVar5;
  ulong uVar6;
  ptls_cipher_suite_t *cs;
  size_t __n;
  st_quicly_handshake_space_t *psVar7;
  int64_t iVar8;
  _func_void_void_ptr_char_ptr_varargs *p_Var9;
  void *pvVar10;
  size_t sVar11;
  ptls_t *tls;
  long lVar12;
  undefined8 uVar13;
  ptls_iovec_t salt;
  uint64_t uVar14;
  ptls_aead_context_t *ppVar15;
  ptls_cipher_context_t *ctx_00;
  byte bVar16;
  int iVar17;
  int iVar18;
  uint32_t initcwnd;
  uint8_t *puVar19;
  quicly_conn_t *pqVar20;
  char *pcVar21;
  undefined1 *puVar22;
  ptls_cipher_suite_t **pppVar23;
  char *buf;
  char *pcVar24;
  quicly_conn_t *pqVar25;
  ptls_iovec_t cid;
  undefined8 uStack_b0;
  char acStack_a8 [4];
  int local_a4;
  uint64_t uStack_a0;
  int is_ack_only;
  uint64_t next_expected_pn;
  ptls_iovec_t payload;
  uint64_t pn;
  uint64_t offending_frame_type;
  anon_struct_40_3_1d7380ec cipher;
  
  offending_frame_type = 0;
  cipher.ingress.aead = (ptls_aead_context_t *)0x0;
  cipher.ingress.header_protection = (ptls_cipher_context_t *)0x0;
  cipher.egress.aead = (ptls_aead_context_t *)0x0;
  cipher.egress.header_protection = (ptls_cipher_context_t *)0x0;
  pn = 0;
  *conn = (quicly_conn_t *)0x0;
  iVar17 = 0xff01;
  pcVar21 = acStack_a8;
  if ((*(packet->octets).base & 0xf0) == 0xc0) {
    puVar22 = (uint8_t *)0x0;
    if (packet->version == 0xff00001b) {
      puVar22 = get_salt_draft27;
    }
    puVar19 = get_salt_current;
    if (packet->version != 0xff00001d) {
      puVar19 = puVar22;
    }
    pcVar24 = acStack_a8;
    if ((puVar19 != (uint8_t *)0x0) && (pcVar24 = acStack_a8, 0x4af < packet->datagram_size)) {
      uVar6 = (packet->cid).dest.encrypted.len;
      iVar17 = 0x2000a;
      pcVar24 = acStack_a8;
      if (7 < uVar6) {
        pppVar23 = ctx->tls->cipher_suites;
        if (pppVar23 == (ptls_cipher_suite_t **)0x0) {
          uStack_b0 = 0x1225a2;
          __assert_fail("cs != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0x210,"ptls_cipher_suite_t *get_aes128gcmsha256(quicly_context_t *)");
        }
        do {
          cs = *pppVar23;
          pppVar23 = pppVar23 + 1;
        } while (cs->id != 0x1301);
        salt.len = 0x14;
        salt.base = puVar19;
        cid.len = uVar6;
        cid.base = (packet->cid).dest.encrypted.base;
        iVar17 = setup_initial_encryption
                           (cs,(st_quicly_cipher_context_t *)&offending_frame_type,
                            (st_quicly_cipher_context_t *)&cipher.ingress.header_protection,cid,0,
                            salt,(quicly_conn_t *)0x0);
        pcVar24 = acStack_a8;
        if (iVar17 == 0) {
          cipher.egress.header_protection =
               (ptls_cipher_context_t *)CONCAT44(cipher.egress.header_protection._4_4_,1);
          uStack_a0 = 0;
          iVar18 = decrypt_packet((ptls_cipher_context_t *)cipher.ingress.aead,
                                  aead_decrypt_fixed_key,(void *)offending_frame_type,
                                  &stack0xffffffffffffff60,packet,&payload.len,
                                  (ptls_iovec_t *)&next_expected_pn);
          buf = acStack_a8;
          pcVar21 = acStack_a8;
          iVar17 = 0xff09;
          pcVar24 = acStack_a8;
          if (iVar18 == 0) {
            protocol_version = packet->version;
            uStack_b0 = 0x1221fc;
            initcwnd = quicly_cc_calc_initial_cwnd
                                 (ctx->initcwnd_packets,
                                  (uint16_t)(ctx->transport_params).max_udp_payload_size);
            pqVar20 = create_connection(ctx,protocol_version,(char *)0x0,src_addr,dest_addr,
                                        &(packet->cid).src,new_cid,handshake_properties,initcwnd);
            *conn = pqVar20;
            if (pqVar20 == (quicly_conn_t *)0x0) {
              iVar17 = 0x201;
              goto LAB_0012243c;
            }
            (pqVar20->super).state = QUICLY_STATE_ACCEPTING;
            __n = (packet->cid).dest.encrypted.len;
            uStack_b0 = 0x122255;
            memcpy(&(pqVar20->super).original_dcid,(packet->cid).dest.encrypted.base,__n);
            (pqVar20->super).original_dcid.len = (uint8_t)__n;
            if ((address_token != (quicly_address_token_plaintext_t *)0x0) &&
               (paVar1 = &((*conn)->super).remote.address_validation,
               *(byte *)paVar1 = *(byte *)paVar1 | 1,
               address_token->type == QUICLY_ADDRESS_TOKEN_TYPE_RETRY)) {
              pqVar20 = *conn;
              *(undefined8 *)((pqVar20->retry_scid).cid + 0xd) =
                   *(undefined8 *)((pqVar20->super).original_dcid.cid + 0xd);
              uVar13 = *(undefined8 *)((pqVar20->super).original_dcid.cid + 8);
              *(undefined8 *)(pqVar20->retry_scid).cid =
                   *(undefined8 *)(pqVar20->super).original_dcid.cid;
              *(undefined8 *)((pqVar20->retry_scid).cid + 8) = uVar13;
              pqVar20 = *conn;
              *(undefined8 *)((pqVar20->super).original_dcid.cid + 0xd) =
                   *(undefined8 *)((long)&address_token->field_4 + 0xd);
              uVar13 = *(undefined8 *)((long)&address_token->field_4 + 8);
              *(undefined8 *)(pqVar20->super).original_dcid.cid =
                   *(undefined8 *)&address_token->field_4;
              *(undefined8 *)((pqVar20->super).original_dcid.cid + 8) = uVar13;
            }
            uStack_b0 = 0x1222c1;
            iVar17 = setup_handshake_space_and_flow(*conn,0);
            pcVar24 = acStack_a8;
            if (iVar17 == 0) {
              psVar7 = (*conn)->initial;
              (psVar7->super).next_expected_packet_number = uStack_a0;
              (psVar7->cipher).ingress.aead = (ptls_aead_context_t *)offending_frame_type;
              (psVar7->cipher).ingress.header_protection =
                   (ptls_cipher_context_t *)cipher.ingress.aead;
              psVar7 = (*conn)->initial;
              (psVar7->cipher).egress.aead = (ptls_aead_context_t *)cipher.ingress.header_protection
              ;
              (psVar7->cipher).egress.header_protection =
                   (ptls_cipher_context_t *)cipher.egress.aead;
              cipher.egress.header_protection =
                   (ptls_cipher_context_t *)
                   ((ulong)cipher.egress.header_protection & 0xffffffff00000000);
              ((*conn)->crypto).handshake_properties.collected_extensions =
                   server_collected_extensions;
              pqVar25 = *conn;
              pqVar25->initial->largest_ingress_udp_payload_size = (uint16_t)packet->datagram_size;
              pqVar20 = pqVar25;
              if (quicly_trace_fp != (FILE *)0x0) {
                uStack_b0 = 0x122491;
                iVar17 = ptls_skip_tracing((pqVar25->crypto).tls);
                buf = acStack_a8;
                if (iVar17 == 0) {
                  iVar8 = ((*conn)->stash).now;
                  sVar11 = (packet->cid).dest.encrypted.len;
                  lVar12 = -(sVar11 * 2 + 0x10 & 0xfffffffffffffff0);
                  buf = acStack_a8 + lVar12;
                  puVar19 = (packet->cid).dest.encrypted.base;
                  *(undefined8 *)((long)&uStack_b0 + lVar12) = 0x1224c5;
                  pcVar21 = ptls_hexdump(buf,puVar19,sVar11);
                  uVar5 = (pqVar25->super).local.cid_set.plaintext.master_id;
                  *(undefined8 *)((long)&uStack_b0 + lVar12) = 0x1224e6;
                  fprintf((FILE *)quicly_trace_fp,
                          "{\"type\":\"accept\", \"conn\":%u, \"time\":%lld, \"dcid\":\"%s\", \"address-token\":\"0x%llx\"}\n"
                          ,(ulong)uVar5,iVar8,pcVar21,address_token);
                }
                pqVar20 = *conn;
                pqVar25 = pqVar20;
                if (quicly_trace_fp != (FILE *)0x0) {
                  tls = (pqVar20->crypto).tls;
                  builtin_strncpy(buf + -8,"\x04%\x12",4);
                  buf[-4] = '\0';
                  buf[-3] = '\0';
                  buf[-2] = '\0';
                  buf[-1] = '\0';
                  iVar17 = ptls_skip_tracing(tls);
                  sVar11 = payload.len;
                  puVar19 = payload.base;
                  uVar14 = next_expected_pn;
                  pqVar25 = *conn;
                  if (iVar17 == 0) {
                    iVar8 = (pqVar25->stash).now;
                    uVar4 = *(packet->octets).base;
                    buf[-8] = 'D';
                    buf[-7] = '%';
                    buf[-6] = '\x12';
                    buf[-5] = '\0';
                    buf[-4] = '\0';
                    buf[-3] = '\0';
                    buf[-2] = '\0';
                    buf[-1] = '\0';
                    bVar16 = get_epoch(uVar4);
                    uVar5 = (pqVar20->super).local.cid_set.plaintext.master_id;
                    *(ulong *)(buf + -8) = (ulong)bVar16;
                    *(uint8_t **)(buf + -0x10) = puVar19;
                    buf[-0x18] = 'p';
                    buf[-0x17] = '%';
                    buf[-0x16] = '\x12';
                    buf[-0x15] = '\0';
                    buf[-0x14] = '\0';
                    buf[-0x13] = '\0';
                    buf[-0x12] = '\0';
                    buf[-0x11] = '\0';
                    fprintf((FILE *)quicly_trace_fp,
                            "{\"type\":\"packet-received\", \"conn\":%u, \"time\":%lld, \"pn\":%llu, \"decrypted\":\"0x%llx\", \"decrypted-len\":%llu, \"packet-type\":%llu}\n"
                            ,(ulong)uVar5,iVar8,sVar11,uVar14);
                    pqVar25 = *conn;
                  }
                }
              }
              iVar8 = (pqVar25->stash).now;
              uVar4 = *(packet->octets).base;
              builtin_strncpy(buf + -8,"i#\x12",4);
              buf[-4] = '\0';
              buf[-3] = '\0';
              buf[-2] = '\0';
              buf[-1] = '\0';
              bVar16 = get_epoch(uVar4);
              p_Var9 = (pqVar20->super).tracer.cb;
              if (p_Var9 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
                pvVar10 = (pqVar20->super).tracer.ctx;
                *(ulong *)(buf + -0x10) = (ulong)bVar16;
                buf[-0x18] = -0x61;
                buf[-0x17] = '#';
                buf[-0x16] = '\x12';
                buf[-0x15] = '\0';
                buf[-0x14] = '\0';
                buf[-0x13] = '\0';
                buf[-0x12] = '\0';
                buf[-0x11] = '\0';
                (*p_Var9)(pvVar10,
                          "{\"type\":\"packet-received\", \"time\":%lld, \"pn\":%llu, \"decrypted\":\"0x%llx\", \"decrypted-len\":%llu, \"packet-type\":%llu}\n"
                          ,iVar8,payload.len,next_expected_pn,payload.base);
              }
              pqVar20 = *conn;
              paVar2 = &(pqVar20->super).stats;
              (paVar2->num_packets).received = (paVar2->num_packets).received + 1;
              paVar3 = &(pqVar20->super).stats.num_bytes;
              paVar3->received = paVar3->received + packet->datagram_size;
              buf[-8] = -0x29;
              buf[-7] = '#';
              buf[-6] = '\x12';
              buf[-5] = '\0';
              buf[-4] = '\0';
              buf[-3] = '\0';
              buf[-2] = '\0';
              buf[-1] = '\0';
              iVar17 = handle_payload(pqVar20,0,(uint8_t *)next_expected_pn,(size_t)payload.base,&pn
                                      ,&local_a4);
              pcVar24 = buf;
              if (iVar17 == 0) {
                pqVar20 = *conn;
                psVar7 = pqVar20->initial;
                iVar8 = (pqVar20->stash).now;
                buf[-8] = -3;
                buf[-7] = '#';
                buf[-6] = '\x12';
                buf[-5] = '\0';
                buf[-4] = '\0';
                buf[-3] = '\0';
                buf[-2] = '\0';
                buf[-1] = '\0';
                iVar17 = record_receipt(&psVar7->super,payload.len,0,iVar8,
                                        &(pqVar20->egress).send_ack_at);
              }
            }
          }
        }
      }
    }
    uVar14 = pn;
    pqVar20 = *conn;
    pcVar21 = pcVar24;
    if (pqVar20 != (quicly_conn_t *)0x0) {
      if (iVar17 == 0) {
        (pqVar20->super).state = QUICLY_STATE_CONNECTED;
      }
      else {
        builtin_strncpy(pcVar24 + -8,"&$\x12",4);
        pcVar24[-4] = '\0';
        pcVar24[-3] = '\0';
        pcVar24[-2] = '\0';
        pcVar24[-1] = '\0';
        initiate_close(pqVar20,iVar17,uVar14,"");
        pqVar20 = *conn;
      }
      builtin_strncpy(pcVar24 + -8,":$\x12",4);
      pcVar24[-4] = '\0';
      pcVar24[-3] = '\0';
      pcVar24[-2] = '\0';
      pcVar24[-1] = '\0';
      unlock_now(pqVar20);
      iVar17 = 0;
    }
  }
LAB_0012243c:
  uVar14 = offending_frame_type;
  if ((int)cipher.egress.header_protection != 0) {
    builtin_strncpy(pcVar21 + -8,"N$\x12",4);
    pcVar21[-4] = '\0';
    pcVar21[-3] = '\0';
    pcVar21[-2] = '\0';
    pcVar21[-1] = '\0';
    ptls_aead_free((ptls_aead_context_t *)uVar14);
    ppVar15 = cipher.ingress.aead;
    builtin_strncpy(pcVar21 + -8,"W$\x12",4);
    pcVar21[-4] = '\0';
    pcVar21[-3] = '\0';
    pcVar21[-2] = '\0';
    pcVar21[-1] = '\0';
    ptls_cipher_free((ptls_cipher_context_t *)ppVar15);
    ctx_00 = cipher.ingress.header_protection;
    builtin_strncpy(pcVar21 + -8,"`$\x12",4);
    pcVar21[-4] = '\0';
    pcVar21[-3] = '\0';
    pcVar21[-2] = '\0';
    pcVar21[-1] = '\0';
    ptls_aead_free((ptls_aead_context_t *)ctx_00);
    ppVar15 = cipher.egress.aead;
    builtin_strncpy(pcVar21 + -8,"i$\x12",4);
    pcVar21[-4] = '\0';
    pcVar21[-3] = '\0';
    pcVar21[-2] = '\0';
    pcVar21[-1] = '\0';
    ptls_cipher_free((ptls_cipher_context_t *)ppVar15);
  }
  return iVar17;
}

Assistant:

int quicly_accept(quicly_conn_t **conn, quicly_context_t *ctx, struct sockaddr *dest_addr, struct sockaddr *src_addr,
                  quicly_decoded_packet_t *packet, quicly_address_token_plaintext_t *address_token,
                  const quicly_cid_plaintext_t *new_cid, ptls_handshake_properties_t *handshake_properties)
{
    const struct st_ptls_salt_t *salt;
    struct {
        struct st_quicly_cipher_context_t ingress, egress;
        int alive;
    } cipher = {};
    ptls_iovec_t payload;
    uint64_t next_expected_pn, pn, offending_frame_type = QUICLY_FRAME_TYPE_PADDING;
    int is_ack_only, ret;

    *conn = NULL;

    /* process initials only */
    if ((packet->octets.base[0] & QUICLY_PACKET_TYPE_BITMASK) != QUICLY_PACKET_TYPE_INITIAL) {
        ret = QUICLY_ERROR_PACKET_IGNORED;
        goto Exit;
    }
    if ((salt = get_salt(packet->version)) == NULL) {
        ret = QUICLY_ERROR_PACKET_IGNORED;
        goto Exit;
    }
    if (packet->datagram_size < QUICLY_MIN_CLIENT_INITIAL_SIZE) {
        ret = QUICLY_ERROR_PACKET_IGNORED;
        goto Exit;
    }
    if (packet->cid.dest.encrypted.len < 8) {
        ret = QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
        goto Exit;
    }
    if ((ret = setup_initial_encryption(get_aes128gcmsha256(ctx), &cipher.ingress, &cipher.egress, packet->cid.dest.encrypted, 0,
                                        ptls_iovec_init(salt->initial, sizeof(salt->initial)), NULL)) != 0)
        goto Exit;
    cipher.alive = 1;
    next_expected_pn = 0; /* is this correct? do we need to take care of underflow? */
    if ((ret = decrypt_packet(cipher.ingress.header_protection, aead_decrypt_fixed_key, cipher.ingress.aead, &next_expected_pn,
                              packet, &pn, &payload)) != 0) {
        ret = QUICLY_ERROR_DECRYPTION_FAILED;
        goto Exit;
    }

    /* create connection */
    if ((*conn = create_connection(
             ctx, packet->version, NULL, src_addr, dest_addr, &packet->cid.src, new_cid, handshake_properties,
             quicly_cc_calc_initial_cwnd(ctx->initcwnd_packets, ctx->transport_params.max_udp_payload_size))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    (*conn)->super.state = QUICLY_STATE_ACCEPTING;
    quicly_set_cid(&(*conn)->super.original_dcid, packet->cid.dest.encrypted);
    if (address_token != NULL) {
        (*conn)->super.remote.address_validation.validated = 1;
        if (address_token->type == QUICLY_ADDRESS_TOKEN_TYPE_RETRY) {
            (*conn)->retry_scid = (*conn)->super.original_dcid;
            (*conn)->super.original_dcid = address_token->retry.original_dcid;
        }
    }
    if ((ret = setup_handshake_space_and_flow(*conn, QUICLY_EPOCH_INITIAL)) != 0)
        goto Exit;
    (*conn)->initial->super.next_expected_packet_number = next_expected_pn;
    (*conn)->initial->cipher.ingress = cipher.ingress;
    (*conn)->initial->cipher.egress = cipher.egress;
    cipher.alive = 0;
    (*conn)->crypto.handshake_properties.collected_extensions = server_collected_extensions;
    (*conn)->initial->largest_ingress_udp_payload_size = packet->datagram_size;

    QUICLY_PROBE(ACCEPT, *conn, (*conn)->stash.now,
                 QUICLY_PROBE_HEXDUMP(packet->cid.dest.encrypted.base, packet->cid.dest.encrypted.len), address_token);
    QUICLY_PROBE(PACKET_RECEIVED, *conn, (*conn)->stash.now, pn, payload.base, payload.len, get_epoch(packet->octets.base[0]));

    /* handle the input; we ignore is_ack_only, we consult if there's any output from TLS in response to CH anyways */
    (*conn)->super.stats.num_packets.received += 1;
    (*conn)->super.stats.num_bytes.received += packet->datagram_size;
    if ((ret = handle_payload(*conn, QUICLY_EPOCH_INITIAL, payload.base, payload.len, &offending_frame_type, &is_ack_only)) != 0)
        goto Exit;
    if ((ret = record_receipt(&(*conn)->initial->super, pn, 0, (*conn)->stash.now, &(*conn)->egress.send_ack_at)) != 0)
        goto Exit;

Exit:
    if (*conn != NULL) {
        if (ret == 0) {
            (*conn)->super.state = QUICLY_STATE_CONNECTED;
        } else {
            initiate_close(*conn, ret, offending_frame_type, "");
            ret = 0;
        }
        unlock_now(*conn);
    }
    if (cipher.alive) {
        dispose_cipher(&cipher.ingress);
        dispose_cipher(&cipher.egress);
    }
    return ret;
}